

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::testHorizForcedBreaking(Test *this)

{
  char cVar1;
  int iVar2;
  AutoTableElement *pAVar3;
  QLatin1String latin1;
  QArrayDataPointer<QRect> local_98;
  Report report;
  QArrayDataPointer<QRect> local_68;
  QArrayDataPointer<char16_t> local_48;
  QRect local_28;
  
  if (fontFound) {
    fillModel(this,2,10,false);
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)&report);
    pAVar3 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::AutoTableElement::AutoTableElement
              ((AutoTableElement *)&local_68,(QAbstractItemModel *)&this->m_model);
    KDReports::MainTable::setAutoTableElement(pAVar3);
    KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_68);
    KDReports::Report::scaleTo((int)&report,2);
    latin1.m_data = "Noto Sans";
    latin1.m_size = 9;
    QString::QString((QString *)&local_68,latin1);
    QFont::QFont((QFont *)&local_98,(QString *)&local_68,0x18,-1,false);
    KDReports::Report::setDefaultFont((QFont *)&report);
    QFont::~QFont((QFont *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    iVar2 = KDReports::Report::numberOfPages();
    cVar1 = QTest::qCompare(iVar2,2,"report.numberOfPages()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0x112);
    if (cVar1 != '\0') {
      KDReports::Report::mainTable();
      local_68.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
      local_98.d = (Data *)0x3ff0000000000000;
      cVar1 = QTest::qCompare((double *)&local_68,(double *)&local_98,
                              "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0x113);
      if (cVar1 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        local_98.size = 0;
        local_98.d = (Data *)0x0;
        local_98.ptr = (QRect *)0x0;
        local_48.d = (Data *)0x0;
        local_48.ptr = (char16_t *)0x900000000;
        QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_98,(QRect *)&local_48);
        local_28.x1 = 1;
        local_28.y1 = 0;
        local_28.x2 = 1;
        local_28.y2 = 9;
        QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_98,&local_28);
        QTest::qCompare<QRect>
                  ((QList<QRect> *)&local_68,(QList<QRect> *)&local_98,
                   "report.mainTable()->pageRects()",
                   "QList<QRect>() << QRect(0, 0, 1, 10) << QRect(1, 0, 1, 10)",
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                   ,0x115);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_68);
      }
    }
    KDReports::Report::~Report(&report);
  }
  else {
    QString::QString((QString *)&local_98,"Font %1 not found");
    QString::QString((QString *)&local_48,"Noto Sans");
    QString::arg((QString *)&report,(int)&local_98,(QChar)(char16_t)&local_48);
    QString::toLatin1_helper_inplace((QString *)&local_68);
    if (local_68.ptr == (QRect *)0x0) {
      local_68.ptr = (QRect *)&QByteArray::_empty;
    }
    QTest::qSkip((char *)local_68.ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x109);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  }
  return;
}

Assistant:

void testHorizForcedBreaking()
    {
        SKIP_IF_FONT_NOT_FOUND

        // There would be room for a single page horizontally, but the user forced 2
        fillModel(2, 10);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(2, 1);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 24));
        QCOMPARE(report.numberOfPages(), 2);
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, 1, 10) << QRect(1, 0, 1, 10));
    }